

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem,uchar *pub,size_t *size,int compressed)

{
  uchar uVar1;
  int iVar2;
  int compressed_local;
  size_t *size_local;
  uchar *pub_local;
  secp256k1_ge *elem_local;
  
  iVar2 = secp256k1_ge_is_infinity(elem);
  if (iVar2 == 0) {
    secp256k1_fe_normalize_var(&elem->x);
    secp256k1_fe_normalize_var(&elem->y);
    secp256k1_fe_get_b32(pub + 1,&elem->x);
    if (compressed == 0) {
      *size = 0x41;
      *pub = '\x04';
      secp256k1_fe_get_b32(pub + 0x21,&elem->y);
    }
    else {
      *size = 0x21;
      iVar2 = secp256k1_fe_is_odd(&elem->y);
      uVar1 = '\x02';
      if (iVar2 != 0) {
        uVar1 = '\x03';
      }
      *pub = uVar1;
    }
    elem_local._4_4_ = 1;
  }
  else {
    elem_local._4_4_ = 0;
  }
  return elem_local._4_4_;
}

Assistant:

static int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem, unsigned char *pub, size_t *size, int compressed) {
    if (secp256k1_ge_is_infinity(elem)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&elem->x);
    secp256k1_fe_normalize_var(&elem->y);
    secp256k1_fe_get_b32(&pub[1], &elem->x);
    if (compressed) {
        *size = 33;
        pub[0] = secp256k1_fe_is_odd(&elem->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    } else {
        *size = 65;
        pub[0] = SECP256K1_TAG_PUBKEY_UNCOMPRESSED;
        secp256k1_fe_get_b32(&pub[33], &elem->y);
    }
    return 1;
}